

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O3

void ht_add(htable *ht,void *new,size_t h)

{
  uintptr_t *puVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  bVar2 = (byte)ht->bits;
  uVar5 = ~(-1 << (bVar2 & 0x1f));
  uVar3 = (ulong)((uint)h & uVar5);
  puVar1 = ht->table;
  uVar4 = ht->perfect_bit;
  if (1 < puVar1[uVar3]) {
    uVar4 = 0;
    do {
      uVar3 = (ulong)((int)uVar3 + 1U & uVar5);
    } while (1 < puVar1[uVar3]);
  }
  puVar1[uVar3] =
       ~ht->common_mask & (ulong)new | uVar4 |
       ~ht->perfect_bit & ht->common_mask & (h >> (bVar2 & 0x3f) ^ h);
  return;
}

Assistant:

static void ht_add(struct htable *ht, const void *new, size_t h)
{
	size_t i;
	uintptr_t perfect = ht->perfect_bit;

	i = hash_bucket(ht, h);

	while (entry_is_valid(ht->table[i])) {
		perfect = 0;
		i = (i + 1) & ((1 << ht->bits)-1);
	}
	ht->table[i] = make_hval(ht, new, get_hash_ptr_bits(ht, h)|perfect);
}